

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
StatisticsWriter::writeHistogram<double>
          (StatisticsWriter *this,ostream *stream,string *title,DynamicHistogram<double> *histogram)

{
  double dVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  long *plVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  int iVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  ios *this_00;
  pointer pdVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  string entry;
  double d;
  string indent;
  string header;
  string footer;
  stringstream parser;
  char *local_390;
  long local_388;
  char local_380;
  undefined1 uStack_37f;
  undefined1 uStack_37e;
  undefined1 uStack_37d;
  undefined4 uStack_37c;
  pointer local_370;
  pointer local_368;
  pointer local_360;
  long *local_358;
  double local_350;
  double local_348;
  StatisticsWriter *local_340;
  pointer local_338;
  pointer local_330;
  pointer local_328;
  uint local_31c;
  long *local_318;
  long *local_310;
  long *local_308;
  long *local_300;
  long *local_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0 [2];
  pointer local_2d0;
  pointer local_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  long *local_2a0 [2];
  long local_290 [2];
  string *local_280;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_340 = this;
  local_280 = title;
  plVar6 = (long *)operator_new(0x30);
  plVar6[4] = 0;
  plVar6[5] = 0;
  plVar6[2] = 0;
  plVar6[3] = 0;
  *plVar6 = 0;
  plVar6[1] = 0;
  local_358 = plVar6;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Bin Min","");
  StringParser::updateWidthString(&local_1d8,plVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Bin Max","");
  local_2f8 = plVar6 + 1;
  StringParser::updateWidthString(&local_1f8,local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Center","");
  local_300 = plVar6 + 2;
  StringParser::updateWidthString(&local_218,local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Frequency","");
  local_308 = plVar6 + 3;
  StringParser::updateWidthString(&local_238,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"PDF","");
  local_310 = plVar6 + 4;
  StringParser::updateWidthString(&local_258,local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CDF","");
  local_318 = plVar6 + 5;
  StringParser::updateWidthString(&local_278,local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_31c = DynamicHistogram<double>::count(histogram);
  DynamicHistogram<double>::frequencies
            ((vector<double,_std::allocator<double>_> *)local_1b8,histogram);
  uVar3 = local_1b8._0_8_;
  local_328 = (pointer)local_1b8._8_8_;
  local_368 = local_1a8;
  DynamicHistogram<double>::pdf((vector<double,_std::allocator<double>_> *)local_1b8,histogram);
  uVar4 = local_1b8._0_8_;
  local_330 = (pointer)local_1b8._8_8_;
  local_370 = local_1a8;
  DynamicHistogram<double>::cdf((vector<double,_std::allocator<double>_> *)local_1b8,histogram);
  local_360 = (pointer)local_1b8._0_8_;
  local_338 = (pointer)local_1b8._8_8_;
  local_2d0 = local_1a8;
  local_2c8 = (pointer)(ulong)local_31c;
  if (local_31c != 0) {
    pdVar12 = (pointer)((long)local_328 - uVar3 >> 3);
    pdVar14 = (pointer)((long)local_330 - uVar4 >> 3);
    pdVar15 = (pointer)((long)(local_1b8._8_8_ - local_1b8._0_8_) >> 3);
    pdVar11 = (pointer)0x0;
    do {
      StringParser::updateWidthNumber<long>((long)pdVar11,local_358);
      iVar10 = (int)pdVar11;
      local_348 = DynamicHistogram<double>::bin(histogram,iVar10);
      dVar1 = DynamicHistogram<double>::width(histogram,iVar10);
      StringParser::updateWidthNumber<double>(local_348 + dVar1 * -0.5,local_2f8);
      local_348 = DynamicHistogram<double>::bin(histogram,iVar10);
      dVar1 = DynamicHistogram<double>::width(histogram,iVar10);
      StringParser::updateWidthNumber<double>(local_348 + dVar1 * 0.5,local_300);
      pdVar13 = pdVar12;
      if (((pdVar12 == pdVar11) ||
          (StringParser::updateWidthNumber<long_long>
                     ((long)*(double *)(uVar3 + pdVar11 * 8),local_308), pdVar13 = pdVar14,
          pdVar14 == pdVar11)) ||
         (StringParser::updateWidthNumber<double>(*(double *)(uVar4 + pdVar11 * 8),local_310),
         pdVar13 = pdVar15, pdVar15 == pdVar11)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pdVar13,pdVar13);
      }
      StringParser::updateWidthNumber<double>(local_360[(long)pdVar11],local_318);
      pdVar11 = (pointer)((long)pdVar11 + 1);
    } while (local_2c8 != pdVar11);
  }
  lVar9 = 0;
  lVar2 = 0;
  lVar7 = 0;
  do {
    lVar17 = local_358[lVar7] + 3;
    lVar18 = (local_358 + lVar7)[1] + 3;
    local_358[lVar7] = lVar17;
    (local_358 + lVar7)[1] = lVar18;
    lVar9 = lVar9 + lVar17;
    lVar2 = lVar2 + lVar18;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 6);
  uVar16 = lVar2 + lVar9;
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct((string *)&local_2c0,uVar16,'=');
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct((string *)local_2a0,uVar16,'-');
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(local_340->_comment)._M_dataplus._M_p,
                      (local_340->_comment)._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_2c0,local_2b8);
  cVar5 = std::ios::widen((ios *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18)),'\n');
  poVar8 = (ostream *)std::ostream::put(poVar8,cVar5);
  std::ostream::flush(poVar8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(local_340->_comment)._M_dataplus._M_p,
                      (local_340->_comment)._M_string_length);
  lVar9 = *(long *)poVar8;
  this_00 = (ios *)(poVar8 + *(long *)(lVar9 + -0x18));
  if (poVar8[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen(this_00,' ');
    this_00[0xe1] = (ios)0x1;
    lVar9 = *(long *)poVar8;
  }
  this_00[0xe0] = (ios)0x20;
  *(long *)(poVar8 + *(long *)(lVar9 + -0x18) + 0x10) =
       (long)(int)(uVar16 - ((long)uVar16 >> 0x3f) >> 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Histogram of ",0xd);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
  cVar5 = std::ios::widen((ios *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18)),'\n');
  poVar8 = (ostream *)std::ostream::put(poVar8,cVar5);
  std::ostream::flush(poVar8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(local_340->_comment)._M_dataplus._M_p,
                      (local_340->_comment)._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_2c0,local_2b8);
  cVar5 = std::ios::widen((ios *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18)),'\n');
  poVar8 = (ostream *)std::ostream::put(poVar8,cVar5);
  std::ostream::flush(poVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)stream,(local_340->_comment)._M_dataplus._M_p,
             (local_340->_comment)._M_string_length);
  lVar9 = *(long *)stream;
  lVar2 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_358;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Bin",3);
  lVar9 = *(long *)stream;
  lVar2 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_2f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Min",3);
  lVar9 = *(long *)stream;
  lVar2 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_300;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Max",3);
  lVar9 = *(long *)stream;
  lVar2 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_308;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Frequency",9);
  lVar9 = *(long *)stream;
  lVar2 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_310;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"PDF",3);
  lVar9 = *(long *)stream;
  lVar2 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_318;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"CDF",3);
  cVar5 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
  poVar8 = (ostream *)std::ostream::put((ostream *)stream,cVar5);
  std::ostream::flush(poVar8);
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct
            ((string *)&local_2f0,(local_340->_comment)._M_string_length,' ');
  if (local_31c != 0) {
    local_328 = (pointer)((long)local_328 - uVar3 >> 3);
    local_330 = (pointer)((long)local_330 - uVar4 >> 3);
    local_338 = (pointer)((long)local_338 - (long)local_360 >> 3);
    pdVar11 = (pointer)0x0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)stream,(char *)local_2f0,local_2e8);
      lVar9 = *(long *)stream;
      lVar2 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_358;
      iVar10 = (int)pdVar11;
      local_350 = (double)((ulong)pdVar11 & 0xffffffff);
      local_390 = &local_380;
      if (NAN(local_350)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<long>((ostream *)&local_1a8,(long)pdVar11);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar2 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_2f8;
      local_348 = DynamicHistogram<double>::bin(histogram,iVar10);
      dVar1 = DynamicHistogram<double>::width(histogram,iVar10);
      local_350 = local_348 + dVar1 * -0.5;
      local_390 = &local_380;
      if (NAN(local_350)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_348 = local_350;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_348);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar2 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_300;
      local_348 = DynamicHistogram<double>::bin(histogram,iVar10);
      dVar1 = DynamicHistogram<double>::width(histogram,iVar10);
      local_350 = local_348 + dVar1 * 0.5;
      local_390 = &local_380;
      if (NAN(local_350)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_348 = local_350;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_348);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar2 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_308;
      if (local_328 == pdVar11) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   local_328);
      }
      dVar1 = *(double *)(uVar3 + pdVar11 * 8);
      local_350 = (double)(long)dVar1;
      local_390 = &local_380;
      if (NAN(local_350)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<long_long>((ostream *)&local_1a8,(long)dVar1);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar2 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_310;
      if (local_330 == pdVar11) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   local_330);
      }
      local_350 = *(double *)(uVar4 + pdVar11 * 8);
      local_390 = &local_380;
      if (NAN(local_350)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_348 = local_350;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_348);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar2 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_318;
      if (local_338 == pdVar11) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   local_338);
      }
      local_350 = local_360[(long)pdVar11];
      local_390 = &local_380;
      if (NAN(local_350)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_348 = local_350;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_348);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      cVar5 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
      poVar8 = (ostream *)std::ostream::put((ostream *)stream,cVar5);
      std::ostream::flush(poVar8);
      pdVar11 = (pointer)((long)pdVar11 + 1);
    } while (local_2c8 != pdVar11);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  plVar6 = local_358;
  pdVar11 = local_360;
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0,local_2b0[0] + 1);
  }
  operator_delete(plVar6,0x30);
  if (pdVar11 != (pointer)0x0) {
    operator_delete(pdVar11,(long)local_2d0 - (long)pdVar11);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_370 - uVar4);
  }
  if ((pointer)uVar3 != (pointer)0x0) {
    operator_delete((void *)uVar3,(long)local_368 - uVar3);
  }
  cVar5 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
  poVar8 = (ostream *)std::ostream::put((ostream *)stream,cVar5);
  std::ostream::flush(poVar8);
  return;
}

Assistant:

void
    writeHistogram(std::ostream & stream,
                   std::string const & title,
                   DynamicHistogram<T> & histogram)
    {

        try
        {

            unsigned int nBins = 0;
            std::vector<double> freq;
            std::vector<double> pdf;
            std::vector<double> cdf;

            // Compute column widths
            std::vector<long> width(6,0);
            StringParser::updateWidthString("Bin Min", width[0]);
            StringParser::updateWidthString("Bin Max", width[1]);
            StringParser::updateWidthString("Center", width[2]);
            StringParser::updateWidthString("Frequency", width[3]);
            StringParser::updateWidthString("PDF", width[4]);
            StringParser::updateWidthString("CDF", width[5]);

            nBins = histogram.count();
            freq = histogram.frequencies();
            pdf = histogram.pdf();
            cdf = histogram.cdf();
            for (unsigned int i = 0; i < nBins; i++)
            {
                StringParser::updateWidthNumber<long>(i, width[0]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)-histogram.width(i)/2, width[1]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)+histogram.width(i)/2, width[2]);
                StringParser::updateWidthNumber<long long>((long long)freq.at(i), width[3]);
                StringParser::updateWidthNumber<double>(pdf.at(i), width[4]);
                StringParser::updateWidthNumber<double>(cdf.at(i), width[5]);
            }

            long totalWidth = 0;
            for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
            {
                (*it) += 3;
                totalWidth += *it;
            }

            // Print data headers
            std::string header(totalWidth,'=');
            std::string footer(totalWidth,'-');
            stream << this->_comment << header << std::endl;
            stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << "Histogram of " << title << std::endl;
            stream << this->_comment << header << std::endl;
            stream << this->_comment;
            stream << std::right << std::setw(width[0]) << "Bin"
                   << std::right << std::setw(width[1]) << "Min"
                   << std::right << std::setw(width[2]) << "Max"
                   << std::right << std::setw(width[3]) << "Frequency"
                   << std::right << std::setw(width[4]) << "PDF"
                   << std::right << std::setw(width[5]) << "CDF"
                   << std::endl;

            // Print data
            std::string indent(this->_comment.size(), ' ');
            for (unsigned int i = 0; i < nBins; i++)
            {
                stream << indent;
                stream << std::right << std::setw(width[0]) << StringParser::parseNumber<long>(i);
                stream << std::right << std::setw(width[1]) << StringParser::parseNumber<double>(histogram.bin(i)-histogram.width(i)/2);
                stream << std::right << std::setw(width[2]) << StringParser::parseNumber<double>(histogram.bin(i)+histogram.width(i)/2);
                stream << std::right << std::setw(width[3]) << StringParser::parseNumber<long long>((long long)freq.at(i));
                stream << std::right << std::setw(width[4]) << StringParser::parseNumber<double>(pdf.at(i));
                stream << std::right << std::setw(width[5]) << StringParser::parseNumber<double>(cdf.at(i));
                stream << std::endl;
            }

        }
        catch (...)
        {
            stream << "No valid data" << std::endl;
        }
        stream << std::endl;

        return;
    }